

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTexture.cpp
# Opt level: O0

bool __thiscall
sf::RenderTexture::create(RenderTexture *this,uint width,uint height,bool depthBuffer)

{
  uint depth;
  bool bVar1;
  ContextSettings local_38;
  undefined1 local_19;
  uint local_18;
  uint uStack_14;
  bool depthBuffer_local;
  uint height_local;
  uint width_local;
  RenderTexture *this_local;
  
  depth = 0;
  if (depthBuffer) {
    depth = 0x20;
  }
  local_19 = depthBuffer;
  local_18 = height;
  uStack_14 = width;
  _height_local = this;
  ContextSettings::ContextSettings(&local_38,depth,0,0,1,1,0,false);
  bVar1 = create(this,width,height,&local_38);
  return bVar1;
}

Assistant:

bool RenderTexture::create(unsigned int width, unsigned int height, bool depthBuffer)
{
    return create(width, height, ContextSettings(depthBuffer ? 32 : 0));
}